

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20-poly1305.c
# Opt level: O3

void poly1305_feed_chunk(poly1305 *ctx,uchar *chunk,int len)

{
  ulong *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  byte bVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong local_78 [9];
  
  local_78[0] = 0;
  local_78[1] = 0;
  local_78[2] = 0;
  if (0 < len) {
    bVar35 = 0;
    uVar36 = 0;
    do {
      puVar1 = (ulong *)((long)local_78 + (ulong)((uint)uVar36 & 0xfffffff8));
      *puVar1 = *puVar1 | (ulong)chunk[uVar36] << (bVar35 & 0x38);
      uVar36 = uVar36 + 1;
      bVar35 = bVar35 + 8;
    } while ((uint)len != uVar36);
  }
  iVar23 = len + 7;
  if (-1 < len) {
    iVar23 = len;
  }
  local_78[iVar23 >> 3] = local_78[iVar23 >> 3] | 1L << ((byte)(len % 8 << 3) & 0x3f);
  uVar36 = (ctx->h).w[0];
  uVar34 = uVar36 + local_78[0];
  uVar38 = (ctx->h).w[1];
  uVar36 = (ulong)CARRY8(uVar36,local_78[0]);
  uVar40 = uVar38 + local_78[1];
  uVar39 = uVar40 + uVar36;
  uVar37 = (ctx->h).w[2] + local_78[2] +
           (ulong)(CARRY8(uVar38,local_78[1]) || CARRY8(uVar40,uVar36));
  uVar36 = (ctx->r).w[0];
  uVar38 = (ctx->r).w[1];
  uVar40 = (ctx->r).w[2];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar36;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar34;
  uVar28 = SUB168(auVar2 * auVar12,8);
  uVar24 = SUB168(auVar2 * auVar12,0);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar38;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar34;
  uVar29 = SUB168(auVar3 * auVar13,8);
  uVar25 = SUB168(auVar3 * auVar13,0);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar40;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar34;
  uVar30 = SUB168(auVar4 * auVar14,8);
  uVar34 = SUB168(auVar4 * auVar14,0);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar39;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar36;
  uVar31 = SUB168(auVar5 * auVar15,8);
  uVar26 = SUB168(auVar5 * auVar15,0);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar39;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar38;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar39;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar40;
  uVar39 = SUB168(auVar7 * auVar17,0);
  uVar27 = uVar25 + uVar28;
  uVar25 = (ulong)CARRY8(uVar25,uVar28);
  uVar28 = uVar34 + uVar29;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar28 + uVar25;
  uVar25 = (ulong)(CARRY8(uVar34,uVar29) || CARRY8(uVar28,uVar25));
  uVar28 = uVar39 + uVar30;
  uVar33 = uVar28 + uVar25;
  auVar21 = auVar6 * auVar16 + auVar21;
  uVar29 = auVar21._0_8_;
  uVar34 = uVar29 + uVar31;
  uVar32 = uVar34 + CARRY8(uVar27,uVar26);
  uVar29 = auVar21._8_8_ +
           (ulong)(CARRY8(uVar29,uVar31) || CARRY8(uVar34,(ulong)CARRY8(uVar27,uVar26)));
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar37;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar36;
  uVar34 = SUB168(auVar8 * auVar18,8);
  uVar36 = SUB168(auVar8 * auVar18,0);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar38;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar37;
  auVar22._8_8_ =
       uVar37 * uVar40 +
       SUB168(auVar7 * auVar17,8) + (ulong)(CARRY8(uVar39,uVar30) || CARRY8(uVar28,uVar25)) +
       (ulong)CARRY8(uVar29,uVar33);
  auVar22._0_8_ = uVar29 + uVar33;
  auVar22 = auVar9 * auVar19 + auVar22;
  uVar25 = auVar22._0_8_;
  uVar40 = uVar36 + uVar32;
  uVar36 = (ulong)CARRY8(uVar36,uVar32);
  uVar38 = uVar25 + uVar34;
  uVar28 = uVar38 + uVar36;
  uVar38 = auVar22._8_8_ + (ulong)(CARRY8(uVar25,uVar34) || CARRY8(uVar38,uVar36));
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar40 >> 2 | uVar28 << 0x3e;
  uVar25 = SUB168(auVar10 * ZEXT816(5),0);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar28 >> 2 | uVar38 << 0x3e;
  auVar20._8_8_ = (ulong)((uint)(uVar38 >> 2) & 3) * 5 + (ulong)((uint)uVar40 & 3);
  auVar20._0_8_ = SUB168(auVar10 * ZEXT816(5),8);
  auVar20 = auVar11 * ZEXT816(5) + auVar20;
  uVar28 = auVar20._0_8_;
  uVar36 = uVar27 + uVar26 + (ulong)CARRY8(uVar25,uVar24) + uVar28;
  uVar40 = (uVar38 >> 4) * 0x19;
  uVar38 = (ulong)CARRY8(uVar40,uVar25 + uVar24);
  (ctx->h).w[0] = uVar40 + uVar25 + uVar24;
  (ctx->h).w[1] = uVar36 + uVar38;
  (ctx->h).w[2] =
       (ulong)(CARRY8(uVar27 + uVar26,uVar28) ||
              CARRY8(uVar27 + uVar26 + uVar28,(ulong)CARRY8(uVar25,uVar24))) + auVar20._8_8_ +
       (ulong)CARRY8(uVar36,uVar38);
  return;
}

Assistant:

static void poly1305_feed_chunk(struct poly1305 *ctx,
                                const unsigned char *chunk, int len)
{
    bigval c;
    bigval_import_le(&c, chunk, len);
    c.w[len / BIGNUM_INT_BYTES] |=
        (BignumInt)1 << (8 * (len % BIGNUM_INT_BYTES));
    bigval_add(&c, &c, &ctx->h);
    bigval_mul_mod_p(&ctx->h, &c, &ctx->r);
}